

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hpp
# Opt level: O1

size_t __thiscall lattice::graph::add_bond(graph *this,size_t s,size_t t,int tp)

{
  pointer *ppbVar1;
  iterator __position;
  pointer psVar2;
  iterator iVar3;
  ulong uVar4;
  invalid_argument *this_00;
  size_t b;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  bond_t local_28;
  
  uVar4 = ((long)(this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  local_38 = t;
  local_30 = s;
  if ((uVar4 < s || uVar4 - s == 0) || (uVar4 < t || uVar4 - t == 0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"site index out of range");
  }
  else {
    if (s != t) {
      __position._M_current =
           (this->bonds_).
           super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_40 = ((long)__position._M_current -
                  (long)(this->bonds_).
                        super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      local_28.source = s;
      local_28.target = t;
      local_28.type = tp;
      if (__position._M_current ==
          (this->bonds_).
          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>::
        _M_realloc_insert<lattice::graph::bond_t>(&this->bonds_,__position,&local_28);
      }
      else {
        *(ulong *)&(__position._M_current)->type = CONCAT44(local_28._20_4_,tp);
        (__position._M_current)->source = s;
        (__position._M_current)->target = t;
        ppbVar1 = &(this->bonds_).
                   super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppbVar1 = *ppbVar1 + 1;
      }
      psVar2 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3._M_current =
           *(pointer *)
            ((long)&psVar2[local_30].neighbors.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&psVar2[local_30].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar2[local_30].neighbors,iVar3,&local_38);
      }
      else {
        *iVar3._M_current = local_38;
        *(unsigned_long **)
         ((long)&psVar2[local_30].neighbors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar3._M_current + 1;
      }
      psVar2 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3._M_current =
           *(pointer *)
            ((long)&psVar2[local_30].neighbor_bonds.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&psVar2[local_30].neighbor_bonds.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar2[local_30].neighbor_bonds,iVar3,&local_40);
      }
      else {
        *iVar3._M_current = local_40;
        *(unsigned_long **)
         ((long)&psVar2[local_30].neighbor_bonds.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar3._M_current + 1;
      }
      psVar2 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3._M_current =
           *(pointer *)
            ((long)&psVar2[local_38].neighbors.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&psVar2[local_38].neighbors.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar2[local_38].neighbors,iVar3,&local_30);
      }
      else {
        *iVar3._M_current = local_30;
        *(unsigned_long **)
         ((long)&psVar2[local_38].neighbors.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar3._M_current + 1;
      }
      psVar2 = (this->sites_).
               super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>.
               _M_impl.super__Vector_impl_data._M_start;
      iVar3._M_current =
           *(pointer *)
            ((long)&psVar2[local_38].neighbor_bonds.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8);
      if (iVar3._M_current ==
          *(pointer *)
           ((long)&psVar2[local_38].neighbor_bonds.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 0x10)
         ) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                   &psVar2[local_38].neighbor_bonds,iVar3,&local_40);
      }
      else {
        *iVar3._M_current = local_40;
        *(unsigned_long **)
         ((long)&psVar2[local_38].neighbor_bonds.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl + 8) =
             iVar3._M_current + 1;
      }
      return local_40;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"self loop is not allowed");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

std::size_t add_bond(std::size_t s, std::size_t t, int tp) {
    if (s >= sites_.size() || t >= sites_.size())
      throw std::invalid_argument("site index out of range");
    if (s == t)
      throw std::invalid_argument("self loop is not allowed");
    std::size_t b = bonds_.size();
    bonds_.push_back(bond_t(s, t, tp));
    sites_[s].neighbors.push_back(t);
    sites_[s].neighbor_bonds.push_back(b);
    sites_[t].neighbors.push_back(s);
    sites_[t].neighbor_bonds.push_back(b);
    return b;
  }